

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,FILE *fp)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int id;
  int len;
  char vstr [16];
  int local_50;
  int local_4c;
  char local_48 [24];
  
  clear(this);
  local_50 = 0;
  iVar2 = __isoc99_fscanf(fp,"%d=");
  if (iVar2 == 1) {
    do {
      if (local_50 < -0x5b03) {
        local_50 = -0x5b04 - local_50;
        local_4c = 0;
        iVar2 = __isoc99_fscanf(fp,"%d",&local_4c);
        if (iVar2 != 1) {
          load_param();
          return -1;
        }
        Mat::create(&this->params[local_50].v,local_4c,4,(Allocator *)0x0);
        if (0 < local_4c) {
          lVar4 = 0;
          lVar5 = 0;
          do {
            iVar2 = __isoc99_fscanf(fp,",%15[^,\n ]",local_48);
            if (iVar2 != 1) {
              load_param();
              return -1;
            }
            bVar1 = vstr_is_float(local_48);
            if (bVar1) {
              pcVar3 = "%f";
            }
            else {
              pcVar3 = "%d";
            }
            iVar2 = __isoc99_sscanf(local_48,pcVar3,(long)this->params[local_50].v.data + lVar4);
            if (iVar2 != 1) {
              load_param();
              return -1;
            }
            lVar5 = lVar5 + 1;
            lVar4 = lVar4 + 4;
          } while (lVar5 < local_4c);
        }
      }
      else {
        iVar2 = __isoc99_fscanf(fp,"%15s",local_48);
        if (iVar2 != 1) {
          load_param();
          return -1;
        }
        bVar1 = vstr_is_float(local_48);
        pcVar3 = "%d";
        if (bVar1) {
          pcVar3 = "%f";
        }
        iVar2 = __isoc99_sscanf(local_48,pcVar3,&this->params[local_50].field_1);
        if (iVar2 != 1) {
          load_param();
          return -1;
        }
      }
      this->params[local_50].loaded = 1;
      iVar2 = __isoc99_fscanf(fp,"%d=",&local_50);
    } while (iVar2 == 1);
  }
  return 0;
}

Assistant:

int ParamDict::load_param(FILE* fp)
{
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (fscanf(fp, "%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = fscanf(fp, "%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length fail\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = fscanf(fp, ",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element fail\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element fail\n");
                    return -1;
                }
            }
        }
        else
        {
            char vstr[16];
            int nscan = fscanf(fp, "%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value fail\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value fail\n");
                return -1;
            }
        }

        params[id].loaded = 1;
    }

    return 0;
}